

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

void hashSeed_x4(uint8_t **digest,tree_t *tree,uint8_t *salt,uint8_t hashPrefix,uint repIndex,
                uint nodeIndex,picnic_instance_t *params)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short in_R9W;
  uint16_t nodes [4];
  hash_context_x4 ctx;
  size_t seed_size;
  undefined6 in_stack_fffffffffffffc88;
  uint16_t in_stack_fffffffffffffc8e;
  undefined2 in_stack_fffffffffffffc90;
  undefined2 in_stack_fffffffffffffc92;
  undefined2 in_stack_fffffffffffffc94;
  undefined2 in_stack_fffffffffffffc96;
  size_t in_stack_fffffffffffffca0;
  uint8_t *in_stack_fffffffffffffca8;
  hash_context_x4 *in_stack_fffffffffffffcb0;
  uint8_t *in_stack_fffffffffffffcb8;
  uint8_t *in_stack_fffffffffffffcc0;
  uint8_t *in_stack_fffffffffffffcc8;
  hash_context_x4 *in_stack_fffffffffffffcd0;
  
  hash_init_prefix_x4((hash_context_x4 *)
                      CONCAT26(in_stack_fffffffffffffc96,
                               CONCAT24(in_stack_fffffffffffffc94,
                                        CONCAT22(in_stack_fffffffffffffc92,in_stack_fffffffffffffc90
                                                ))),
                      CONCAT26(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88),'\0');
  hash_update_x4_4(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                   in_stack_fffffffffffffcb8,(uint8_t *)in_stack_fffffffffffffcb0,
                   (size_t)in_stack_fffffffffffffca8);
  hash_update_x4_1(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  hash_update_x4_uint16_le
            ((hash_context_x4 *)
             CONCAT26(in_stack_fffffffffffffc96,
                      CONCAT24(in_stack_fffffffffffffc94,
                               CONCAT22(in_stack_fffffffffffffc92,in_stack_fffffffffffffc90))),
             in_stack_fffffffffffffc8e);
  sVar1 = in_R9W + 1;
  sVar2 = in_R9W + 2;
  sVar3 = in_R9W + 3;
  hash_update_x4_uint16s_le
            ((hash_context_x4 *)CONCAT26(sVar3,CONCAT24(sVar2,CONCAT22(sVar1,in_R9W))),
             (uint16_t *)CONCAT26(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88));
  hash_final_x4((hash_context_x4 *)0x153aca);
  hash_squeeze_x4((hash_context_x4 *)CONCAT26(sVar3,CONCAT24(sVar2,CONCAT22(sVar1,in_R9W))),
                  (uint8_t **)CONCAT26(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88),0x153ae7
                 );
  return;
}

Assistant:

static void hashSeed_x4(uint8_t** digest, const tree_t* tree, uint8_t* salt, uint8_t hashPrefix,
                        unsigned int repIndex, unsigned int nodeIndex,
                        const picnic_instance_t* params) {
  const size_t seed_size = params->seed_size;

  hash_context_x4 ctx;
  hash_init_prefix_x4(&ctx, params->digest_size, hashPrefix);
  hash_update_x4_4(&ctx, &tree->nodes[nodeIndex * seed_size],
                   &tree->nodes[(nodeIndex + 1) * seed_size],
                   &tree->nodes[(nodeIndex + 2) * seed_size],
                   &tree->nodes[(nodeIndex + 3) * seed_size], seed_size);

  hash_update_x4_1(&ctx, salt, SALT_SIZE);
  hash_update_x4_uint16_le(&ctx, repIndex);

  const uint16_t nodes[4] = {nodeIndex, nodeIndex + 1, nodeIndex + 2, nodeIndex + 3};
  hash_update_x4_uint16s_le(&ctx, nodes);

  hash_final_x4(&ctx);
  hash_squeeze_x4(&ctx, digest, 2 * seed_size);
  hash_clear_x4(&ctx);
}